

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O3

InvokeResult __thiscall
anon_unknown.dwarf_66e608::cmForEachFunctionBlocker::invoke
          (cmForEachFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  InvokeResult IVar6;
  cmExecutionStatus status;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e0;
  bool local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *local_a0;
  cmExecutionStatus local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (this == (cmForEachFunctionBlocker *)functions) {
    IVar6.Restore = true;
    IVar6.Break = false;
  }
  else {
    paVar1 = &local_98.Error.field_2;
    bVar3 = true;
    bVar4 = false;
    local_a0 = functions;
    do {
      local_98.Error.field_2._8_6_ = 0x2e726f727265;
      local_98.Error.field_2._M_allocated_capacity._0_6_ = 0x776f6e6b6e75;
      local_98.Error.field_2._M_allocated_capacity._6_2_ = 0x206e;
      local_98.Error._M_string_length = 0xe;
      local_98.Error.field_2._M_local_buf[0xe] = '\0';
      local_98.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_98.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.ReturnInvoked = false;
      local_98.BreakInvoked = false;
      local_98.ContinueInvoked = false;
      local_98.NestedError = false;
      local_c0 = false;
      local_98.Makefile = mf;
      local_98.Error._M_dataplus._M_p = (pointer)paVar1;
      cmMakefile::ExecuteCommand
                (mf,(cmListFileFunction *)this,&local_98,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0);
      if ((local_c0 == true) &&
         (local_c0 = false,
         local_e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e0._M_value + 0x10))) {
        operator_delete((void *)local_e0._M_value._M_dataplus._M_p,local_e0._16_8_ + 1);
      }
      if (local_98.ReturnInvoked == true) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_b8,&local_98.Variables);
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (inStatus->Variables).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (inStatus->Variables).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (inStatus->Variables).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (inStatus->Variables).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (inStatus->Variables).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (inStatus->Variables).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        inStatus->ReturnInvoked = true;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b8);
LAB_00243d1e:
        bVar2 = 1;
        bVar4 = true;
      }
      else {
        if (local_98.BreakInvoked != false) goto LAB_00243d1e;
        bVar2 = 1;
        if (local_98.ContinueInvoked == false) {
          if (local_98.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>._M_engaged == true) {
            (inStatus->ExitCode).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int> =
                 (_Optional_payload_base<int>)
                 ((ulong)(uint)local_98.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
                               super__Optional_payload_base<int>._M_payload._M_value | 0x100000000);
          }
          else {
            if ((cmSystemTools::s_FatalErrorOccurred == false) &&
               (bVar5 = cmSystemTools::GetInterruptFlag(), !bVar5)) {
              bVar2 = 0;
              goto LAB_00243d23;
            }
            bVar3 = false;
          }
          goto LAB_00243d1e;
        }
      }
LAB_00243d23:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98.Variables);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.Error._M_dataplus._M_p != paVar1) {
        operator_delete(local_98.Error._M_dataplus._M_p,
                        CONCAT26(local_98.Error.field_2._M_allocated_capacity._6_2_,
                                 local_98.Error.field_2._M_allocated_capacity._0_6_) + 1);
      }
      this = (cmForEachFunctionBlocker *)
             &(this->super_cmFunctionBlocker).StartingContext.Name._M_string_length;
    } while (!(bool)(bVar2 | this == (cmForEachFunctionBlocker *)local_a0));
    IVar6.Break = bVar4;
    IVar6.Restore = bVar3;
  }
  return IVar6;
}

Assistant:

auto cmForEachFunctionBlocker::invoke(
  std::vector<cmListFileFunction> const& functions,
  cmExecutionStatus& inStatus, cmMakefile& mf) -> InvokeResult
{
  InvokeResult result = { true, false };
  // Invoke all the functions that were collected in the block.
  for (cmListFileFunction const& func : functions) {
    cmExecutionStatus status(mf);
    mf.ExecuteCommand(func, status);
    if (status.GetReturnInvoked()) {
      inStatus.SetReturnInvoked(status.GetReturnVariables());
      result.Break = true;
      break;
    }
    if (status.GetBreakInvoked()) {
      result.Break = true;
      break;
    }
    if (status.GetContinueInvoked()) {
      break;
    }
    if (status.HasExitCode()) {
      inStatus.SetExitCode(status.GetExitCode());
      result.Break = true;
      break;
    }
    if (cmSystemTools::GetFatalErrorOccurred()) {
      result.Restore = false;
      result.Break = true;
      break;
    }
  }
  return result;
}